

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NodePrintFanio(FILE *pFile,Abc_Obj_t *pNode)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  int local_24;
  int i;
  Abc_Obj_t *pNode2;
  Abc_Obj_t *pNode_local;
  FILE *pFile_local;
  
  iVar1 = Abc_ObjIsPo(pNode);
  pNode2 = pNode;
  if (iVar1 != 0) {
    pNode2 = Abc_ObjFanin0(pNode);
  }
  pcVar3 = Abc_ObjName(pNode2);
  fprintf((FILE *)pFile,"Node %s",pcVar3);
  fprintf((FILE *)pFile,"\n");
  uVar2 = Abc_ObjFaninNum(pNode2);
  fprintf((FILE *)pFile,"Fanins (%d): ",(ulong)uVar2);
  for (local_24 = 0; iVar1 = Abc_ObjFaninNum(pNode2), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar4 = Abc_ObjFanin(pNode2,local_24);
    pcVar3 = Abc_ObjName(pAVar4);
    fprintf((FILE *)pFile," %s",pcVar3);
  }
  fprintf((FILE *)pFile,"\n");
  uVar2 = Abc_ObjFaninNum(pNode2);
  fprintf((FILE *)pFile,"Fanouts (%d): ",(ulong)uVar2);
  for (local_24 = 0; iVar1 = Abc_ObjFanoutNum(pNode2), local_24 < iVar1; local_24 = local_24 + 1) {
    pAVar4 = Abc_ObjFanout(pNode2,local_24);
    pcVar3 = Abc_ObjName(pAVar4);
    fprintf((FILE *)pFile," %s",pcVar3);
  }
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Abc_NodePrintFanio( FILE * pFile, Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode2;
    int i;
    if ( Abc_ObjIsPo(pNode) )
        pNode = Abc_ObjFanin0(pNode);

    fprintf( pFile, "Node %s", Abc_ObjName(pNode) );
    fprintf( pFile, "\n" );

    fprintf( pFile, "Fanins (%d): ", Abc_ObjFaninNum(pNode) );
    Abc_ObjForEachFanin( pNode, pNode2, i )
        fprintf( pFile, " %s", Abc_ObjName(pNode2) );
    fprintf( pFile, "\n" );

    fprintf( pFile, "Fanouts (%d): ", Abc_ObjFaninNum(pNode) );
    Abc_ObjForEachFanout( pNode, pNode2, i )
        fprintf( pFile, " %s", Abc_ObjName(pNode2) );
    fprintf( pFile, "\n" );
}